

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

bool __thiscall
presolve::HPresolve::rowCoefficientsIntegral(HPresolve *this,HighsInt row,double scale)

{
  double *pdVar1;
  int iVar2;
  HighsInt HVar3;
  double dVar4;
  double dVar5;
  iterator __end1;
  iterator __begin1;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  int local_90;
  iterator local_88;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> local_48;
  
  local_48.nodeValue =
       (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.nodeIndex =
       (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_48.nodeLeft =
       (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_48.nodeRight =
       (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_48.root =
       (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[row];
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(&local_88,&local_48);
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = -1;
  while( true ) {
    HVar3 = local_88.currentNode;
    iVar2 = local_90;
    if (local_88.currentNode == local_90) break;
    dVar5 = *local_88.pos_.value_;
    dVar4 = round(dVar5 * scale);
    dVar5 = ABS(dVar5 * scale - dVar4);
    pdVar1 = &(this->options->super_HighsOptionsStruct).small_matrix_value;
    if (*pdVar1 <= dVar5 && dVar5 != *pdVar1) break;
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_88);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_88.stack.super__Vector_base<int,_std::allocator<int>_>);
  return HVar3 == iVar2;
}

Assistant:

bool HPresolve::rowCoefficientsIntegral(HighsInt row, double scale) const {
  for (const HighsSliceNonzero& nz : getRowVector(row)) {
    if (fractionality(nz.value() * scale) > options->small_matrix_value)
      return false;
  }

  return true;
}